

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

CatalogException *
duckdb::Catalog::CreateMissingEntryException
          (CatalogEntryRetriever *retriever,EntryLookupInfo *lookup_info,
          reference_set_t<SchemaCatalogEntry> *schemas)

{
  double dVar1;
  bool bVar2;
  DatabaseManager *qualify_database_00;
  DBConfig *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  reference pbVar10;
  EntryLookupInfo *in_RDX;
  CatalogEntryRetriever *in_RSI;
  string *in_RDI;
  pair<std::__detail::_Node_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true,_true>,_bool>
  pVar11;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  string last;
  string did_you_mean;
  SimilarCatalogEntry *entry;
  iterator __end3_1;
  iterator __begin3_1;
  vector<duckdb::SimilarCatalogEntry,_true> *__range3_1;
  string qualified_name;
  bool qualify_schema;
  bool qualify_database;
  string schema_name;
  string catalog_name;
  SimilarCatalogEntry *unseen_entry;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::SimilarCatalogEntry,_true> *__range2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suggestions;
  vector<duckdb::SimilarCatalogEntry,_true> unseen_entries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  string list_of_types;
  value_type *function_type_1;
  CatalogType function_type;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>
  *function;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
  *__range3;
  string extension_for_error;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  other_types;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
  lookup_result;
  string *entry_name;
  CatalogType type;
  string extension_name;
  reference_wrapper<duckdb::SchemaCatalogEntry> *current_schema;
  iterator __end2;
  iterator __begin2;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *__range2;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> current_schemas;
  Catalog *catalog;
  reference_wrapper<duckdb::AttachedDatabase> database;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *__range1;
  RETURN_TYPE max_schema_count;
  DBConfig *config;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> databases;
  DatabaseManager *db_manager;
  reference_set_t<SchemaCatalogEntry> unseen_schemas;
  vector<duckdb::SimilarCatalogEntry,_true> entries;
  ClientContext *context;
  CatalogException *error;
  value_type *in_stack_fffffffffffff7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e0;
  allocator *paVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  string *in_stack_fffffffffffff7f0;
  ClientContext *in_stack_fffffffffffff7f8;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  undefined1 in_stack_fffffffffffff816;
  undefined1 in_stack_fffffffffffff817;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff818;
  string *in_stack_fffffffffffff820;
  string *in_stack_fffffffffffff828;
  ClientContext *in_stack_fffffffffffff838;
  DBConfig *in_stack_fffffffffffff840;
  double dVar14;
  ExtensionEntry (*in_stack_fffffffffffff850) [130];
  string *in_stack_fffffffffffff858;
  ClientContext *in_stack_fffffffffffff880;
  DatabaseManager *in_stack_fffffffffffff888;
  undefined1 *in_stack_fffffffffffff8a8;
  CatalogType type_00;
  _Node_iterator_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>
  in_stack_fffffffffffff8b8;
  Catalog *in_stack_fffffffffffff8c0;
  string *this;
  string *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  CatalogEntryRetriever *in_stack_fffffffffffff900;
  reference_set_t<SchemaCatalogEntry> *in_stack_fffffffffffff908;
  EntryLookupInfo *in_stack_fffffffffffff910;
  ClientContext *in_stack_fffffffffffff918;
  undefined1 local_6c1 [33];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [40];
  string local_638 [32];
  string local_618 [32];
  _Base_ptr local_5f8;
  undefined1 local_5f0;
  reference local_5e8;
  SimilarCatalogEntry *local_5e0;
  __normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
  local_5d8;
  undefined1 *local_5d0;
  _Base_ptr local_5c8;
  undefined1 local_5c0;
  string local_5b8 [40];
  string local_590 [32];
  string local_570 [32];
  reference local_550;
  SimilarCatalogEntry *local_548;
  __normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
  local_540;
  undefined1 *local_538;
  undefined1 local_500 [24];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [24];
  string *in_stack_fffffffffffffb70;
  EntryLookupInfo *in_stack_fffffffffffffb78;
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [39];
  allocator local_321;
  string local_320 [38];
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  undefined1 local_209;
  reference local_208;
  int local_1fc;
  string local_1f8 [39];
  CatalogType local_1d1;
  reference local_1d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>
  *local_1c8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>_>
  local_1c0;
  undefined1 *local_1b8;
  string local_1b0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190 [24];
  undefined1 local_178 [24];
  string *local_160;
  CatalogType local_151;
  string local_150 [32];
  _Node_iterator_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_130;
  undefined1 local_128;
  undefined1 local_120 [8];
  reference_wrapper<duckdb::SchemaCatalogEntry> *local_118;
  reference_wrapper<duckdb::SchemaCatalogEntry> *local_110;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  local_108;
  undefined1 *local_100;
  undefined1 local_f8 [24];
  Catalog *local_e0;
  reference_wrapper<duckdb::AttachedDatabase> local_d8;
  reference_wrapper<duckdb::AttachedDatabase> *local_d0;
  __normal_iterator<std::reference_wrapper<duckdb::AttachedDatabase>_*,_std::vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>_>
  local_c8;
  undefined1 *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  DBConfig *local_b0;
  undefined1 local_a8 [40];
  DatabaseManager *local_80;
  undefined1 local_40 [24];
  ClientContext *local_28;
  EntryLookupInfo *local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_28 = CatalogEntryRetriever::GetContext(in_RSI);
  SimilarEntriesInSchemas
            (in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  ::std::
  unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::unordered_set((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                   *)0x2a8ab21);
  qualify_database_00 = DatabaseManager::Get((ClientContext *)0x2a8ab2e);
  local_80 = qualify_database_00;
  DatabaseManager::GetDatabases(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  params = DBConfig::GetConfig((ClientContext *)0x2a8ab74);
  local_b0 = params;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           DBConfig::GetSetting<duckdb::CatalogErrorMaxSchemasSetting>
                     (in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  local_c0 = local_a8;
  local_b8 = pbVar3;
  local_c8._M_current =
       (reference_wrapper<duckdb::AttachedDatabase> *)
       ::std::
       vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ::begin((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                *)in_stack_fffffffffffff7d8);
  local_d0 = (reference_wrapper<duckdb::AttachedDatabase> *)
             ::std::
             vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
             ::end((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    *)in_stack_fffffffffffff7d8);
  while (bVar2 = __gnu_cxx::
                 operator!=<std::reference_wrapper<duckdb::AttachedDatabase>_*,_std::vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>_>
                           ((__normal_iterator<std::reference_wrapper<duckdb::AttachedDatabase>_*,_std::vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>_>
                             *)in_stack_fffffffffffff7e0,
                            (__normal_iterator<std::reference_wrapper<duckdb::AttachedDatabase>_*,_std::vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>_>
                             *)in_stack_fffffffffffff7d8), bVar2) {
    prVar4 = __gnu_cxx::
             __normal_iterator<std::reference_wrapper<duckdb::AttachedDatabase>_*,_std::vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>_>
             ::operator*(&local_c8);
    local_d8._M_data = prVar4->_M_data;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::
             unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ::size((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                     *)0x2a8ac3a);
    if (local_b8 <= pbVar5) break;
    ::std::reference_wrapper<duckdb::AttachedDatabase>::get(&local_d8);
    in_stack_fffffffffffff8c0 = AttachedDatabase::GetCatalog((AttachedDatabase *)0x2a8ac90);
    local_e0 = in_stack_fffffffffffff8c0;
    GetAllSchemas((ClientContext *)in_stack_fffffffffffff8b8._M_cur);
    local_100 = local_f8;
    local_108._M_current =
         (reference_wrapper<duckdb::SchemaCatalogEntry> *)
         ::std::
         vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
         ::begin((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                  *)in_stack_fffffffffffff7d8);
    local_110 = (reference_wrapper<duckdb::SchemaCatalogEntry> *)
                ::std::
                vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ::end((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                       *)in_stack_fffffffffffff7d8);
    while (bVar2 = __gnu_cxx::
                   operator!=<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                             ((__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                               *)in_stack_fffffffffffff7e0,
                              (__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                               *)in_stack_fffffffffffff7d8), bVar2) {
      local_118 = __gnu_cxx::
                  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                  ::operator*(&local_108);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
               ::size((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                       *)0x2a8ad3b);
      if (local_b8 <= pbVar5) break;
      ::std::reference_wrapper<duckdb::SchemaCatalogEntry>::get(local_118);
      in_stack_fffffffffffff8a8 = local_120;
      ::std::reference_wrapper<duckdb::SchemaCatalogEntry>::
      reference_wrapper<duckdb::SchemaCatalogEntry_&,_void,_duckdb::SchemaCatalogEntry_*>
                ((reference_wrapper<duckdb::SchemaCatalogEntry> *)in_stack_fffffffffffff7e0,
                 (SchemaCatalogEntry *)in_stack_fffffffffffff7d8);
      pVar11 = ::std::
               unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
               ::insert((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                         *)in_stack_fffffffffffff7f0,(value_type *)in_stack_fffffffffffff7e8);
      in_stack_fffffffffffff8b8._M_cur =
           (__node_type *)
           pVar11.first.
           super__Node_iterator_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>.
           _M_cur;
      local_128 = pVar11.second;
      local_130._M_cur = in_stack_fffffffffffff8b8._M_cur;
      __gnu_cxx::
      __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
      ::operator++(&local_108);
    }
    vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>::~vector
              ((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)0x2a8adf8);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::AttachedDatabase>_*,_std::vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>_>
    ::operator++(&local_c8);
  }
  ::std::__cxx11::string::string(local_150);
  local_151 = EntryLookupInfo::GetCatalogType(local_18);
  local_160 = EntryLookupInfo::GetEntryName(local_18);
  type_00 = (CatalogType)((ulong)in_stack_fffffffffffff8a8 >> 0x38);
  if ((((local_151 == TABLE_FUNCTION_ENTRY) || (local_151 == SCALAR_FUNCTION_ENTRY)) ||
      (local_151 == AGGREGATE_FUNCTION_ENTRY)) || (local_151 == PRAGMA_FUNCTION_ENTRY)) {
    ExtensionHelper::FindExtensionInFunctionEntries<706UL>
              ((string *)in_stack_fffffffffffff888,
               (ExtensionFunctionEntry (*) [706])in_stack_fffffffffffff880);
    bVar2 = ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
            ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                     *)in_stack_fffffffffffff7f0);
    type_00 = (CatalogType)((ulong)in_stack_fffffffffffff8a8 >> 0x38);
    if (bVar2) {
LAB_02a8b63e:
      local_1fc = 0;
    }
    else {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)0x2a8aeec);
      ::std::__cxx11::string::string(local_1b0);
      local_1b8 = local_178;
      local_1c0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>
            *)::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                       *)in_stack_fffffffffffff7d8);
      local_1c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>
                   *)::std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                     ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>
                            *)in_stack_fffffffffffff7d8);
      while( true ) {
        bVar2 = __gnu_cxx::
                operator!=<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>_>
                          ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>_>
                            *)in_stack_fffffffffffff7e0,
                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>_>
                            *)in_stack_fffffffffffff7d8);
        type_00 = (CatalogType)((ulong)in_stack_fffffffffffff8a8 >> 0x38);
        if (!bVar2) break;
        local_1d0 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>_>
                    ::operator*(&local_1c0);
        local_1d1 = local_1d0->second;
        bVar2 = CompareCatalogTypes(INVALID,INVALID);
        type_00 = (CatalogType)((ulong)in_stack_fffffffffffff8a8 >> 0x38);
        if (bVar2) {
          ::std::__cxx11::string::operator=(local_150,(string *)local_1d0);
          break;
        }
        ::std::__cxx11::string::operator=(local_1b0,(string *)local_1d0);
        CatalogTypeToString((CatalogType)((ulong)in_stack_fffffffffffff8a8 >> 0x38));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        ::std::__cxx11::string::~string(local_1f8);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>_>_>_>
        ::operator++(&local_1c0);
      }
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_1fc = 6;
      }
      else {
        sVar7 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_190);
        if (sVar7 == 1) {
          local_208 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)in_stack_fffffffffffff7e0,(size_type)in_stack_fffffffffffff7d8
                                  );
          local_209 = 0;
          paVar13 = &local_231;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_230,
                     "%s with name \"%s\" is not in the catalog, a function by this name exists in the %s extension, but it\'s of a different type, namely %s"
                     ,paVar13);
          CatalogTypeToString(type_00);
          ::std::__cxx11::string::string(local_278,(string *)local_160);
          ::std::__cxx11::string::string(local_298,local_1b0);
          ::std::__cxx11::string::string(local_2b8,(string *)local_208);
          CatalogException::
          CatalogException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ((CatalogException *)this,in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params,
                     pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff8c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8b8._M_cur);
          ::std::__cxx11::string::~string(local_2b8);
          ::std::__cxx11::string::~string(local_298);
          ::std::__cxx11::string::~string(local_278);
          ::std::__cxx11::string::~string(local_258);
          ::std::__cxx11::string::~string(local_230);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
          local_1fc = 1;
          local_209 = 1;
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2f8,", ",&local_2f9);
          StringUtil::Join((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
          ::std::__cxx11::string::~string(local_2f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          local_2fa = 0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_320,
                     "%s with name \"%s\" is not in the catalog, functions with this name exist in the %s extension, but they are of different types, namely %s"
                     ,&local_321);
          CatalogTypeToString(type_00);
          ::std::__cxx11::string::string(local_368,(string *)local_160);
          ::std::__cxx11::string::string(local_388,local_1b0);
          ::std::__cxx11::string::string(local_3a8,local_2d8);
          CatalogException::
          CatalogException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ((CatalogException *)this,in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params,
                     pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff8c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8b8._M_cur);
          ::std::__cxx11::string::~string(local_3a8);
          ::std::__cxx11::string::~string(local_388);
          ::std::__cxx11::string::~string(local_368);
          ::std::__cxx11::string::~string(local_348);
          ::std::__cxx11::string::~string(local_320);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
          local_1fc = 1;
          local_2fa = 1;
          ::std::__cxx11::string::~string(local_2d8);
        }
      }
      ::std::__cxx11::string::~string(local_1b0);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x2a8b604);
      if (local_1fc == 6) goto LAB_02a8b63e;
    }
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CatalogType>,_true>
               *)0x2a8b656);
    if (local_1fc != 0) goto LAB_02a8c161;
  }
  else if (local_151 == TYPE_ENTRY) {
    ExtensionHelper::FindExtensionInEntries<3UL>
              (in_stack_fffffffffffff858,(ExtensionEntry (*) [3])in_stack_fffffffffffff850);
    ::std::__cxx11::string::operator=(local_150,local_3c8);
    ::std::__cxx11::string::~string(local_3c8);
  }
  else if (local_151 == COPY_FUNCTION_ENTRY) {
    ExtensionHelper::FindExtensionInEntries<2UL>
              (in_stack_fffffffffffff858,(ExtensionEntry (*) [2])in_stack_fffffffffffff850);
    ::std::__cxx11::string::operator=(local_150,local_3e8);
    ::std::__cxx11::string::~string(local_3e8);
  }
  else if (local_151 == COLLATION_ENTRY) {
    ExtensionHelper::FindExtensionInEntries<130UL>
              (in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    ::std::__cxx11::string::operator=(local_150,local_408);
    ::std::__cxx11::string::~string(local_408);
  }
  uVar6 = ::std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    CatalogTypeToString(type_00);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
    ::std::__cxx11::string::~string(local_448);
    ::std::__cxx11::string::~string(local_468);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
    ::std::__cxx11::string::~string(local_4a8);
    ::std::__cxx11::string::~string(local_4c8);
    ExtensionHelper::AddExtensionInstallHintToErrorMsg
              (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (string *)in_stack_fffffffffffff7e8);
    ::std::__cxx11::string::operator=(local_428,local_4e8);
    ::std::__cxx11::string::~string(local_4e8);
    CatalogException::CatalogException
              ((CatalogException *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    local_1fc = 1;
    ::std::__cxx11::string::~string(local_428);
    goto LAB_02a8c161;
  }
  SimilarEntriesInSchemas
            (in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x2a8b9f8);
  bVar2 = ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
          empty((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> *
                )in_stack_fffffffffffff7f0);
  if (bVar2) {
LAB_02a8bd12:
    bVar2 = ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
            ::empty((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                     *)in_stack_fffffffffffff7f0);
    if (!bVar2) {
      local_5d0 = local_40;
      local_5d8._M_current =
           (SimilarCatalogEntry *)
           ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
           ::begin((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                    *)in_stack_fffffffffffff7d8);
      local_5e0 = (SimilarCatalogEntry *)
                  ::std::
                  vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                  ::end((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                         *)in_stack_fffffffffffff7d8);
      while (bVar2 = __gnu_cxx::
                     operator!=<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                               ((__normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                                 *)in_stack_fffffffffffff7e0,
                                (__normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                                 *)in_stack_fffffffffffff7d8), bVar2) {
        local_5e8 = __gnu_cxx::
                    __normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                    ::operator*(&local_5d8);
        pVar12 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                          (value_type *)in_stack_fffffffffffff7f8);
        local_5f8 = (_Base_ptr)pVar12.first._M_node;
        in_stack_fffffffffffff807 = pVar12.second;
        local_5f0 = in_stack_fffffffffffff807;
        __gnu_cxx::
        __normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
        ::operator++(&local_5d8);
      }
    }
  }
  else {
    pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                       ((vector<duckdb::SimilarCatalogEntry,_true> *)in_stack_fffffffffffff7e0,
                        (size_type)in_stack_fffffffffffff7d8);
    if ((pvVar8->score != 1.0) || (NAN(pvVar8->score))) {
      pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                         ((vector<duckdb::SimilarCatalogEntry,_true> *)in_stack_fffffffffffff7e0,
                          (size_type)in_stack_fffffffffffff7d8);
      dVar1 = pvVar8->score;
      bVar2 = ::std::
              vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
              empty((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                     *)in_stack_fffffffffffff7f0);
      if (bVar2) {
        dVar14 = 0.0;
      }
      else {
        pvVar8 = vector<duckdb::SimilarCatalogEntry,_true>::operator[]
                           ((vector<duckdb::SimilarCatalogEntry,_true> *)in_stack_fffffffffffff7e0,
                            (size_type)in_stack_fffffffffffff7d8);
        dVar14 = pvVar8->score;
      }
      if (dVar1 - 0.2 <= dVar14) goto LAB_02a8bd12;
    }
    local_538 = local_500;
    local_540._M_current =
         (SimilarCatalogEntry *)
         ::std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
         begin((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_> *)
               in_stack_fffffffffffff7d8);
    local_548 = (SimilarCatalogEntry *)
                ::std::
                vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>::
                end((vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>
                     *)in_stack_fffffffffffff7d8);
    while (bVar2 = __gnu_cxx::
                   operator!=<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                             ((__normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                               *)in_stack_fffffffffffff7e0,
                              (__normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                               *)in_stack_fffffffffffff7d8), bVar2) {
      local_550 = __gnu_cxx::
                  __normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
                  ::operator*(&local_540);
      optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)in_stack_fffffffffffff7e0);
      in_stack_fffffffffffff828 = GetName((Catalog *)0x2a8bb70);
      ::std::__cxx11::string::string(local_570,(string *)in_stack_fffffffffffff828);
      in_stack_fffffffffffff820 =
           (string *)
           optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                     ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)in_stack_fffffffffffff7e0);
      ::std::__cxx11::string::string(local_590,(string *)(in_stack_fffffffffffff820 + 1));
      FindMinimalQualification
                (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
                 (bool *)qualify_database_00,(bool *)this);
      SimilarCatalogEntry::GetQualifiedName
                ((SimilarCatalogEntry *)in_stack_fffffffffffff818._M_node,
                 (bool)in_stack_fffffffffffff817,(bool)in_stack_fffffffffffff816);
      pVar12 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                        (value_type *)in_stack_fffffffffffff7f8);
      in_stack_fffffffffffff818 = pVar12.first._M_node;
      in_stack_fffffffffffff817 = pVar12.second;
      local_5c8 = in_stack_fffffffffffff818._M_node;
      local_5c0 = in_stack_fffffffffffff817;
      ::std::__cxx11::string::~string(local_5b8);
      ::std::__cxx11::string::~string(local_590);
      ::std::__cxx11::string::~string(local_570);
      __gnu_cxx::
      __normal_iterator<duckdb::SimilarCatalogEntry_*,_std::vector<duckdb::SimilarCatalogEntry,_std::allocator<duckdb::SimilarCatalogEntry>_>_>
      ::operator++(&local_540);
    }
  }
  ::std::__cxx11::string::string(local_618);
  sVar9 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x2a8bdf6);
  if (sVar9 < 3) {
    paVar13 = (allocator *)&stack0xfffffffffffff8f7;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffff8f8," or ",paVar13);
    StringUtil::Join((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    ::std::__cxx11::string::operator=(local_618,(string *)&stack0xfffffffffffff918);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffff918);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffff8f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8f7);
  }
  else {
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rbegin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff7d8);
    pbVar10 = ::std::
              reverse_iterator<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*((reverse_iterator<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff7e0);
    ::std::__cxx11::string::string(local_638,(string *)pbVar10);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7e0,(key_type *)in_stack_fffffffffffff7d8);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(local_6c1 + 1),", ",(allocator *)pbVar3);
    StringUtil::Join((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar3,(char *)in_stack_fffffffffffff7e0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar3,in_stack_fffffffffffff7e0);
    ::std::__cxx11::string::operator=(local_618,local_660);
    ::std::__cxx11::string::~string(local_660);
    ::std::__cxx11::string::~string(local_680);
    ::std::__cxx11::string::~string(local_6a0);
    ::std::__cxx11::string::~string((string *)(local_6c1 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_6c1);
    ::std::__cxx11::string::~string(local_638);
  }
  CatalogException::MissingEntry(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  local_1fc = 1;
  ::std::__cxx11::string::~string(local_618);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x2a8c129);
  vector<duckdb::SimilarCatalogEntry,_true>::~vector
            ((vector<duckdb::SimilarCatalogEntry,_true> *)0x2a8c136);
LAB_02a8c161:
  ::std::__cxx11::string::~string(local_150);
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::~vector
            ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)0x2a8c17b);
  ::std::
  unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::~unordered_set((unordered_set<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    *)0x2a8c188);
  vector<duckdb::SimilarCatalogEntry,_true>::~vector
            ((vector<duckdb::SimilarCatalogEntry,_true> *)0x2a8c195);
  return (CatalogException *)this;
}

Assistant:

CatalogException Catalog::CreateMissingEntryException(CatalogEntryRetriever &retriever,
                                                      const EntryLookupInfo &lookup_info,
                                                      const reference_set_t<SchemaCatalogEntry> &schemas) {
	auto &context = retriever.GetContext();
	auto entries = SimilarEntriesInSchemas(context, lookup_info, schemas);

	reference_set_t<SchemaCatalogEntry> unseen_schemas;
	auto &db_manager = DatabaseManager::Get(context);
	auto databases = db_manager.GetDatabases(context);
	auto &config = DBConfig::GetConfig(context);

	auto max_schema_count = config.GetSetting<CatalogErrorMaxSchemasSetting>(context);
	for (auto database : databases) {
		if (unseen_schemas.size() >= max_schema_count) {
			break;
		}
		auto &catalog = database.get().GetCatalog();
		auto current_schemas = catalog.GetAllSchemas(context);
		for (auto &current_schema : current_schemas) {
			if (unseen_schemas.size() >= max_schema_count) {
				break;
			}
			unseen_schemas.insert(current_schema.get());
		}
	}
	// check if the entry exists in any extension
	string extension_name;
	auto type = lookup_info.GetCatalogType();
	auto &entry_name = lookup_info.GetEntryName();
	if (type == CatalogType::TABLE_FUNCTION_ENTRY || type == CatalogType::SCALAR_FUNCTION_ENTRY ||
	    type == CatalogType::AGGREGATE_FUNCTION_ENTRY || type == CatalogType::PRAGMA_FUNCTION_ENTRY) {
		auto lookup_result = ExtensionHelper::FindExtensionInFunctionEntries(entry_name, EXTENSION_FUNCTIONS);
		do {
			if (lookup_result.empty()) {
				break;
			}
			vector<string> other_types;
			string extension_for_error;
			for (auto &function : lookup_result) {
				auto function_type = function.second;
				if (CompareCatalogTypes(type, function_type)) {
					extension_name = function.first;
					break;
				}
				extension_for_error = function.first;
				other_types.push_back(CatalogTypeToString(function_type));
			}
			if (!extension_name.empty()) {
				break;
			}
			if (other_types.size() == 1) {
				auto &function_type = other_types[0];
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, a function by this name exists "
				                     "in the %s extension, but it's of a different type, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, function_type);
				return error;
			} else {
				D_ASSERT(!other_types.empty());
				auto list_of_types = StringUtil::Join(other_types, ", ");
				auto error =
				    CatalogException("%s with name \"%s\" is not in the catalog, functions with this name exist "
				                     "in the %s extension, but they are of different types, namely %s",
				                     CatalogTypeToString(type), entry_name, extension_for_error, list_of_types);
				return error;
			}
		} while (false);
	} else if (type == CatalogType::TYPE_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_TYPES);
	} else if (type == CatalogType::COPY_FUNCTION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COPY_FUNCTIONS);
	} else if (type == CatalogType::COLLATION_ENTRY) {
		extension_name = ExtensionHelper::FindExtensionInEntries(entry_name, EXTENSION_COLLATIONS);
	}

	// if we found an extension that can handle this catalog entry, create an error hinting the user
	if (!extension_name.empty()) {
		auto error_message = CatalogTypeToString(type) + " with name \"" + entry_name +
		                     "\" is not in the catalog, but it exists in the " + extension_name + " extension.";
		error_message = ExtensionHelper::AddExtensionInstallHintToErrorMsg(context, error_message, extension_name);
		return CatalogException(error_message);
	}

	// entries in other schemas get a penalty
	// however, if there is an exact match in another schema, we will always show it
	static constexpr const double UNSEEN_PENALTY = 0.2;
	auto unseen_entries = SimilarEntriesInSchemas(context, lookup_info, unseen_schemas);
	set<string> suggestions;
	if (!unseen_entries.empty() && (unseen_entries[0].score == 1.0 || unseen_entries[0].score - UNSEEN_PENALTY >
	                                                                      (entries.empty() ? 0.0 : entries[0].score))) {
		// the closest matching entry requires qualification as it is not in the default search path
		// check how to minimally qualify this entry
		for (auto &unseen_entry : unseen_entries) {
			auto catalog_name = unseen_entry.schema->catalog.GetName();
			auto schema_name = unseen_entry.schema->name;
			bool qualify_database;
			bool qualify_schema;
			FindMinimalQualification(retriever, catalog_name, schema_name, qualify_database, qualify_schema);
			auto qualified_name = unseen_entry.GetQualifiedName(qualify_database, qualify_schema);
			suggestions.insert(qualified_name);
		}
	} else if (!entries.empty()) {
		for (auto &entry : entries) {
			suggestions.insert(entry.name);
		}
	}

	string did_you_mean;
	if (suggestions.size() > 2) {
		string last = *suggestions.rbegin();
		suggestions.erase(last);
		did_you_mean = StringUtil::Join(suggestions, ", ") + ", or " + last;
	} else {
		did_you_mean = StringUtil::Join(suggestions, " or ");
	}

	return CatalogException::MissingEntry(lookup_info, did_you_mean);
}